

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3FinishCoding(Parse *pParse)

{
  int iVar1;
  sqlite3 *db_00;
  long lVar2;
  undefined8 *in_RDI;
  Returning *pRet;
  ExprList *pEL;
  char *vtab;
  Schema *pSchema;
  int reg;
  int addrRewind;
  Returning *pReturning;
  int i;
  int iDb;
  Vdbe *v;
  sqlite3 *db;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  Vdbe *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  Expr *pExpr;
  Parse *in_stack_ffffffffffffffc0;
  Vdbe *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int local_20;
  int local_1c;
  Vdbe *local_18;
  
  db_00 = (sqlite3 *)*in_RDI;
  if (*(char *)((long)in_RDI + 0x1e) == '\0') {
    if (*(int *)((long)in_RDI + 0x34) == 0) {
      local_18 = (Vdbe *)in_RDI[2];
      if (local_18 == (Vdbe *)0x0) {
        if ((db_00->init).busy != '\0') {
          *(undefined4 *)(in_RDI + 3) = 0x65;
          return;
        }
        local_18 = sqlite3GetVdbe((Parse *)CONCAT44(in_stack_ffffffffffffffac,
                                                    in_stack_ffffffffffffffa8));
        if (local_18 == (Vdbe *)0x0) {
          *(undefined4 *)(in_RDI + 3) = 1;
        }
      }
      if (local_18 != (Vdbe *)0x0) {
        if (*(char *)((long)in_RDI + 0xe3) != '\0') {
          lVar2 = in_RDI[0x1a];
          in_stack_ffffffffffffffd4 = -0x55555556;
          in_stack_ffffffffffffffd0 = -0x55555556;
          if (*(int *)(lVar2 + 0xbc) != 0) {
            sqlite3VdbeAddOp0(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
            in_stack_ffffffffffffffd4 =
                 sqlite3VdbeAddOp1(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                                   in_stack_ffffffffffffffa8);
            in_stack_ffffffffffffffd0 = *(int *)(lVar2 + 0xc0);
            for (local_20 = 0; local_20 < *(int *)(lVar2 + 0xbc); local_20 = local_20 + 1) {
              sqlite3VdbeAddOp3(in_stack_ffffffffffffffc8,
                                (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                                (int)in_stack_ffffffffffffffc0,
                                (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                                (int)in_stack_ffffffffffffffb8);
            }
            sqlite3VdbeAddOp2(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                              in_stack_ffffffffffffffa8,0);
            sqlite3VdbeAddOp2(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                              in_stack_ffffffffffffffa8,0);
            sqlite3VdbeJumpHere(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
          }
        }
        sqlite3VdbeAddOp0(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
        sqlite3VdbeJumpHere(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
        local_1c = 0;
        do {
          in_stack_ffffffffffffffc8 = (Vdbe *)&DAT_aaaaaaaaaaaaaaaa;
          if ((*(uint *)((long)in_RDI + 0x84) & 1 << ((byte)local_1c & 0x1f)) != 0) {
            sqlite3VdbeUsesBtree(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
            in_stack_ffffffffffffffc8 = (Vdbe *)db_00->aDb[local_1c].pSchema;
            sqlite3VdbeAddOp4Int
                      (in_stack_ffffffffffffffc8,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                       (int)in_stack_ffffffffffffffc0,
                       (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                       (int)in_stack_ffffffffffffffb8,
                       (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
            if ((db_00->init).busy == '\0') {
              sqlite3VdbeChangeP5(local_18,1);
            }
          }
          local_1c = local_1c + 1;
        } while (local_1c < db_00->nDb);
        for (local_20 = 0; local_20 < *(int *)(in_RDI + 0x27); local_20 = local_20 + 1) {
          in_stack_ffffffffffffffc0 =
               (Parse *)sqlite3GetVTable(db_00,*(Table **)(in_RDI[0x32] + (long)local_20 * 8));
          in_stack_ffffffffffffffa8 = -0xb;
          sqlite3VdbeAddOp4((Vdbe *)in_stack_ffffffffffffffc0,
                            (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                            (int)in_stack_ffffffffffffffb8,
                            (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                            (int)in_stack_ffffffffffffffb0,
                            (char *)CONCAT44(in_stack_ffffffffffffffac,0xfffffff5),
                            in_stack_ffffffffffffffd0);
        }
        *(undefined4 *)(in_RDI + 0x27) = 0;
        if (*(int *)((long)in_RDI + 0x9c) != 0) {
          codeTableLocks((Parse *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        }
        if (in_RDI[0x15] != 0) {
          sqlite3AutoincrementBegin
                    ((Parse *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        }
        if (in_RDI[0xb] != 0) {
          pExpr = (Expr *)in_RDI[0xb];
          *(undefined1 *)((long)in_RDI + 0x23) = 0;
          for (local_20 = 0; iVar1._0_1_ = pExpr->op, iVar1._1_1_ = pExpr->affExpr,
              iVar1._2_1_ = pExpr->op2, iVar1._3_1_ = pExpr->field_0x3, local_20 < iVar1;
              local_20 = local_20 + 1) {
            sqlite3ExprCode(in_stack_ffffffffffffffc0,pExpr,
                            (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
          }
        }
        if ((*(char *)((long)in_RDI + 0xe3) != '\0') &&
           (in_stack_ffffffffffffffb0 = (Vdbe *)in_RDI[0x1a],
           *(int *)((long)&in_stack_ffffffffffffffb0->startTime + 4) != 0)) {
          sqlite3VdbeAddOp2(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                            in_stack_ffffffffffffffa8,0);
        }
        sqlite3VdbeGoto(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      }
      if (*(int *)((long)in_RDI + 0x34) == 0) {
        sqlite3VdbeMakeReady(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
        *(undefined4 *)(in_RDI + 3) = 0x65;
      }
      else {
        *(undefined4 *)(in_RDI + 3) = 1;
      }
    }
    else if (db_00->mallocFailed != '\0') {
      *(undefined4 *)(in_RDI + 3) = 7;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FinishCoding(Parse *pParse){
  sqlite3 *db;
  Vdbe *v;
  int iDb, i;

  assert( pParse->pToplevel==0 );
  db = pParse->db;
  assert( db->pParse==pParse );
  if( pParse->nested ) return;
  if( pParse->nErr ){
    if( db->mallocFailed ) pParse->rc = SQLITE_NOMEM;
    return;
  }
  assert( db->mallocFailed==0 );

  /* Begin by generating some termination code at the end of the
  ** vdbe program
  */
  v = pParse->pVdbe;
  if( v==0 ){
    if( db->init.busy ){
      pParse->rc = SQLITE_DONE;
      return;
    }
    v = sqlite3GetVdbe(pParse);
    if( v==0 ) pParse->rc = SQLITE_ERROR;
  }
  assert( !pParse->isMultiWrite
       || sqlite3VdbeAssertMayAbort(v, pParse->mayAbort));
  if( v ){
    if( pParse->bReturning ){
      Returning *pReturning = pParse->u1.pReturning;
      int addrRewind;
      int reg;

      if( pReturning->nRetCol ){
        sqlite3VdbeAddOp0(v, OP_FkCheck);
        addrRewind =
           sqlite3VdbeAddOp1(v, OP_Rewind, pReturning->iRetCur);
        VdbeCoverage(v);
        reg = pReturning->iRetReg;
        for(i=0; i<pReturning->nRetCol; i++){
          sqlite3VdbeAddOp3(v, OP_Column, pReturning->iRetCur, i, reg+i);
        }
        sqlite3VdbeAddOp2(v, OP_ResultRow, reg, i);
        sqlite3VdbeAddOp2(v, OP_Next, pReturning->iRetCur, addrRewind+1);
        VdbeCoverage(v);
        sqlite3VdbeJumpHere(v, addrRewind);
      }
    }
    sqlite3VdbeAddOp0(v, OP_Halt);

    /* The cookie mask contains one bit for each database file open.
    ** (Bit 0 is for main, bit 1 is for temp, and so forth.)  Bits are
    ** set for each database that is used.  Generate code to start a
    ** transaction on each used database and to verify the schema cookie
    ** on each used database.
    */
    assert( pParse->nErr>0 || sqlite3VdbeGetOp(v, 0)->opcode==OP_Init );
    sqlite3VdbeJumpHere(v, 0);
    assert( db->nDb>0 );
    iDb = 0;
    do{
      Schema *pSchema;
      if( DbMaskTest(pParse->cookieMask, iDb)==0 ) continue;
      sqlite3VdbeUsesBtree(v, iDb);
      pSchema = db->aDb[iDb].pSchema;
      sqlite3VdbeAddOp4Int(v,
        OP_Transaction,                    /* Opcode */
        iDb,                               /* P1 */
        DbMaskTest(pParse->writeMask,iDb), /* P2 */
        pSchema->schema_cookie,            /* P3 */
        pSchema->iGeneration               /* P4 */
      );
      if( db->init.busy==0 ) sqlite3VdbeChangeP5(v, 1);
      VdbeComment((v,
            "usesStmtJournal=%d", pParse->mayAbort && pParse->isMultiWrite));
    }while( ++iDb<db->nDb );
#ifndef SQLITE_OMIT_VIRTUALTABLE
    for(i=0; i<pParse->nVtabLock; i++){
      char *vtab = (char *)sqlite3GetVTable(db, pParse->apVtabLock[i]);
      sqlite3VdbeAddOp4(v, OP_VBegin, 0, 0, 0, vtab, P4_VTAB);
    }
    pParse->nVtabLock = 0;
#endif

#ifndef SQLITE_OMIT_SHARED_CACHE
    /* Once all the cookies have been verified and transactions opened,
    ** obtain the required table-locks. This is a no-op unless the
    ** shared-cache feature is enabled.
    */
    if( pParse->nTableLock ) codeTableLocks(pParse);
#endif

    /* Initialize any AUTOINCREMENT data structures required.
    */
    if( pParse->pAinc ) sqlite3AutoincrementBegin(pParse);

    /* Code constant expressions that were factored out of inner loops.
    */
    if( pParse->pConstExpr ){
      ExprList *pEL = pParse->pConstExpr;
      pParse->okConstFactor = 0;
      for(i=0; i<pEL->nExpr; i++){
        assert( pEL->a[i].u.iConstExprReg>0 );
        sqlite3ExprCode(pParse, pEL->a[i].pExpr, pEL->a[i].u.iConstExprReg);
      }
    }

    if( pParse->bReturning ){
      Returning *pRet = pParse->u1.pReturning;
      if( pRet->nRetCol ){
        sqlite3VdbeAddOp2(v, OP_OpenEphemeral, pRet->iRetCur, pRet->nRetCol);
      }
    }

    /* Finally, jump back to the beginning of the executable code. */
    sqlite3VdbeGoto(v, 1);
  }

  /* Get the VDBE program ready for execution
  */
  assert( v!=0 || pParse->nErr );
  assert( db->mallocFailed==0 || pParse->nErr );
  if( pParse->nErr==0 ){
    /* A minimum of one cursor is required if autoincrement is used
    *  See ticket [a696379c1f08866] */
    assert( pParse->pAinc==0 || pParse->nTab>0 );
    sqlite3VdbeMakeReady(v, pParse);
    pParse->rc = SQLITE_DONE;
  }else{
    pParse->rc = SQLITE_ERROR;
  }
}